

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_Boolean UA_NodeId_equal(UA_NodeId *n1,UA_NodeId *n2)

{
  UA_Boolean UVar1;
  
  if ((n1->namespaceIndex == n2->namespaceIndex) && (n1->identifierType == n2->identifierType)) {
    UVar1 = false;
    switch(n1->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
      UVar1 = (n1->identifier).numeric == (n2->identifier).numeric;
      break;
    case UA_NODEIDTYPE_STRING:
    case UA_NODEIDTYPE_BYTESTRING:
      UVar1 = UA_String_equal(&(n1->identifier).string,&(n2->identifier).string);
      return UVar1;
    case UA_NODEIDTYPE_GUID:
      UVar1 = UA_Guid_equal(&(n1->identifier).guid,&(n2->identifier).guid);
      return UVar1;
    }
  }
  else {
    UVar1 = false;
  }
  return UVar1;
}

Assistant:

UA_Boolean
UA_NodeId_equal(const UA_NodeId *n1, const UA_NodeId *n2) {
    if(n1->namespaceIndex != n2->namespaceIndex ||
       n1->identifierType!=n2->identifierType)
        return false;
    switch(n1->identifierType) {
    case UA_NODEIDTYPE_NUMERIC:
        if(n1->identifier.numeric == n2->identifier.numeric)
            return true;
        else
            return false;
    case UA_NODEIDTYPE_STRING:
        return UA_String_equal(&n1->identifier.string,
                               &n2->identifier.string);
    case UA_NODEIDTYPE_GUID:
        return UA_Guid_equal(&n1->identifier.guid,
                             &n2->identifier.guid);
    case UA_NODEIDTYPE_BYTESTRING:
        return UA_ByteString_equal(&n1->identifier.byteString,
                                   &n2->identifier.byteString);
    }
    return false;
}